

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio.c
# Opt level: O3

int write_header(archive_write *a,archive_entry *entry)

{
  int64_t *piVar1;
  wchar_t wVar2;
  mode_t mVar3;
  uint uVar4;
  int iVar5;
  archive_string_conv *sc;
  int *piVar6;
  char *pcVar7;
  dev_t dVar8;
  ulong uVar9;
  ulong uVar10;
  dev_t dVar11;
  int64_t iVar12;
  size_t sVar13;
  char *pcVar14;
  int iVar15;
  int iVar16;
  size_t length;
  size_t v;
  size_t len;
  char *p;
  char *path;
  char h [110];
  int local_cc;
  size_t local_c8;
  char *local_c0;
  size_t local_b8;
  char *local_b0;
  char local_a8 [120];
  
  piVar1 = (int64_t *)a->format_data;
  sc = get_sconv(a);
  wVar2 = _archive_entry_pathname_l(entry,&local_b0,&local_c8,sc);
  if (wVar2 == L'\0') {
    local_cc = 0;
LAB_00150072:
    local_b8 = local_c8;
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = '\0';
    local_a8[9] = '\0';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = '\0';
    local_a8[0x19] = '\0';
    local_a8[0x1a] = '\0';
    local_a8[0x1b] = '\0';
    local_a8[0x1c] = '\0';
    local_a8[0x1d] = '\0';
    local_a8[0x1e] = '\0';
    local_a8[0x1f] = '\0';
    local_a8[0x20] = '\0';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
    local_a8[0x28] = '\0';
    local_a8[0x29] = '\0';
    local_a8[0x2a] = '\0';
    local_a8[0x2b] = '\0';
    local_a8[0x2c] = '\0';
    local_a8[0x2d] = '\0';
    local_a8[0x2e] = '\0';
    local_a8[0x2f] = '\0';
    local_a8[0x30] = '\0';
    local_a8[0x31] = '\0';
    local_a8[0x32] = '\0';
    local_a8[0x33] = '\0';
    local_a8[0x34] = '\0';
    local_a8[0x35] = '\0';
    local_a8[0x36] = '\0';
    local_a8[0x37] = '\0';
    local_a8[0x38] = '\0';
    local_a8[0x39] = '\0';
    local_a8[0x3a] = '\0';
    local_a8[0x3b] = '\0';
    local_a8[0x3c] = '\0';
    local_a8[0x3d] = '\0';
    local_a8[0x3e] = '\0';
    local_a8[0x3f] = '\0';
    local_a8[0x40] = '\0';
    local_a8[0x41] = '\0';
    local_a8[0x42] = '\0';
    local_a8[0x43] = '\0';
    local_a8[0x44] = '\0';
    local_a8[0x45] = '\0';
    local_a8[0x46] = '\0';
    local_a8[0x47] = '\0';
    local_a8[0x48] = '\0';
    local_a8[0x49] = '\0';
    local_a8[0x4a] = '\0';
    local_a8[0x4b] = '\0';
    local_a8[0x4c] = '\0';
    local_a8[0x4d] = '\0';
    local_a8[0x4e] = '\0';
    local_a8[0x4f] = '\0';
    local_a8[0x50] = '\0';
    local_a8[0x51] = '\0';
    local_a8[0x52] = '\0';
    local_a8[0x53] = '\0';
    local_a8[0x54] = '\0';
    local_a8[0x55] = '\0';
    local_a8[0x56] = '\0';
    local_a8[0x57] = '\0';
    local_a8[0x58] = '\0';
    local_a8[0x59] = '\0';
    local_a8[0x5a] = '\0';
    local_a8[0x5b] = '\0';
    local_a8[0x5c] = '\0';
    local_a8[0x5d] = '\0';
    local_a8[0x5e] = '\0';
    local_a8[0x5f] = '\0';
    local_a8[0x60] = '\0';
    local_a8[0x61] = '\0';
    local_a8[0x62] = '\0';
    local_a8[99] = '\0';
    local_a8[100] = '\0';
    local_a8[0x65] = '\0';
    local_a8[0x66] = '\0';
    local_a8[0x67] = '\0';
    local_a8[0x68] = '\0';
    local_a8[0x69] = '\0';
    local_a8[0x6a] = '\0';
    local_a8[0x6b] = '\0';
    local_a8[0x6c] = '\0';
    local_a8[0x6d] = '\0';
    format_hex_recursive(0x70701,local_a8,6);
    dVar8 = archive_entry_devmajor(entry);
    if (0xfffffffe < dVar8) {
      dVar8 = 0xffffffff;
    }
    format_hex_recursive(dVar8,local_a8 + 0x3e,8);
    dVar8 = archive_entry_devminor(entry);
    if (0xfffffffe < dVar8) {
      dVar8 = 0xffffffff;
    }
    format_hex_recursive(dVar8,local_a8 + 0x46,8);
    uVar9 = archive_entry_ino64(entry);
    if (0xffffffff < (long)uVar9) {
      archive_set_error(&a->archive,0x22,"large inode number truncated");
      local_cc = -0x14;
    }
    format_hex_recursive(uVar9 & 0xffffffff,local_a8 + 6,8);
    mVar3 = archive_entry_mode(entry);
    format_hex_recursive((ulong)mVar3,local_a8 + 0xe,8);
    uVar9 = archive_entry_uid(entry);
    if (0xfffffffe < uVar9) {
      uVar9 = 0xffffffff;
    }
    format_hex_recursive(uVar9,local_a8 + 0x16,8);
    uVar10 = archive_entry_gid(entry);
    uVar9 = 0xffffffff;
    if (uVar10 < 0xffffffff) {
      uVar9 = uVar10;
    }
    format_hex_recursive(uVar9,local_a8 + 0x1e,8);
    uVar4 = archive_entry_nlink(entry);
    format_hex_recursive((ulong)uVar4,local_a8 + 0x26,8);
    mVar3 = archive_entry_filetype(entry);
    if ((mVar3 == 0x6000) || (mVar3 = archive_entry_filetype(entry), mVar3 == 0x2000)) {
      dVar8 = archive_entry_rdevmajor(entry);
      if (0xfffffffe < dVar8) {
        dVar8 = 0xffffffff;
      }
      format_hex_recursive(dVar8,local_a8 + 0x4e,8);
      dVar11 = archive_entry_rdevminor(entry);
      dVar8 = 0xffffffff;
      if (dVar11 < 0xffffffff) {
        dVar8 = dVar11;
      }
    }
    else {
      format_hex_recursive(0,local_a8 + 0x4e,8);
      dVar8 = 0;
    }
    format_hex_recursive(dVar8,local_a8 + 0x56,8);
    uVar9 = archive_entry_mtime(entry);
    if (0xfffffffe < uVar9) {
      uVar9 = 0xffffffff;
    }
    format_hex_recursive(uVar9,local_a8 + 0x2e,8);
    length = (long)((local_b8 << 0x20) + 0x100000000) >> 0x20;
    v = 0xffffffff;
    if (-1 < (long)length) {
      v = length;
    }
    format_hex_recursive(v,local_a8 + 0x5e,8);
    format_hex_recursive(0,local_a8 + 0x66,8);
    mVar3 = archive_entry_filetype(entry);
    if (mVar3 != 0x8000) {
      archive_entry_set_size(entry,0);
    }
    wVar2 = _archive_entry_symlink_l(entry,&local_c0,&local_c8,sc);
    if (wVar2 != L'\0') {
      piVar6 = __errno_location();
      if (*piVar6 == 0xc) {
        pcVar14 = "Can\'t allocate memory for Likname";
        goto LAB_001502e5;
      }
      pcVar14 = archive_entry_symlink(entry);
      pcVar7 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar14,pcVar7);
      local_cc = -0x14;
    }
    if ((local_c0 == (char *)0x0 || local_c8 == 0) || (*local_c0 == '\0')) {
      uVar9 = archive_entry_size(entry);
    }
    else {
      uVar9 = strlen(local_c0);
    }
    uVar10 = 0xffffffff;
    if (uVar9 < 0xffffffff) {
      uVar10 = uVar9;
    }
    format_hex_recursive(uVar10,local_a8 + 0x36,8);
    if (uVar9 >> 0x20 == 0) {
      iVar5 = __archive_write_output(a,local_a8,0x6e);
      iVar15 = -0x1e;
      iVar16 = iVar15;
      if ((iVar5 == 0) && (iVar5 = __archive_write_output(a,local_b0,length), iVar5 == 0)) {
        uVar4 = 1U - (int)local_b8 & 3;
        if ((uVar4 == 0) || (iVar5 = __archive_write_output(a,"",(ulong)uVar4), iVar5 == 0)) {
          iVar12 = archive_entry_size(entry);
          pcVar14 = local_c0;
          *piVar1 = iVar12;
          *(uint *)(piVar1 + 1) = -(int)iVar12 & 3;
          iVar16 = local_cc;
          if ((local_c0 != (char *)0x0) && (*local_c0 != '\0')) {
            sVar13 = strlen(local_c0);
            iVar5 = __archive_write_output(a,pcVar14,sVar13);
            iVar16 = iVar15;
            if (iVar5 == 0) {
              sVar13 = strlen(local_c0);
              iVar5 = __archive_write_output(a,"",(ulong)(-(int)sVar13 & 3));
              iVar16 = -0x1e;
              if (iVar5 == 0) {
                iVar16 = local_cc;
              }
            }
          }
        }
      }
    }
    else {
      archive_set_error(&a->archive,0x22,"File is too large for this format.");
      iVar16 = -0x19;
    }
  }
  else {
    piVar6 = __errno_location();
    if (*piVar6 != 0xc) {
      pcVar14 = archive_entry_pathname(entry);
      pcVar7 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar14,pcVar7);
      local_cc = -0x14;
      goto LAB_00150072;
    }
    pcVar14 = "Can\'t allocate memory for Pathname";
LAB_001502e5:
    archive_set_error(&a->archive,0xc,pcVar14);
    iVar16 = -0x1e;
  }
  return iVar16;
}

Assistant:

static int
write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct cpio *cpio;
	const char *p, *path;
	int pathlength, ret, ret_final;
	int64_t	ino;
	char h[76];
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;
	size_t len;

	cpio = (struct cpio *)a->format_data;
	ret_final = ARCHIVE_OK;
	sconv = get_sconv(a);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pahtname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif

	ret = archive_entry_pathname_l(entry, &path, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	/* Include trailing null. */
	pathlength = (int)len + 1;

	memset(h, 0, sizeof(h));
	format_octal(070707, h + c_magic_offset, c_magic_size);
	format_octal(archive_entry_dev(entry), h + c_dev_offset, c_dev_size);

	ino = synthesize_ino_value(cpio, entry);
	if (ino < 0) {
		archive_set_error(&a->archive, ENOMEM,
		    "No memory for ino translation table");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	} else if (ino > 0777777) {
		archive_set_error(&a->archive, ERANGE,
		    "Too many files for this cpio format");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	format_octal(ino & 0777777, h + c_ino_offset, c_ino_size);

	/* TODO: Set ret_final to ARCHIVE_WARN if any of these overflow. */
	format_octal(archive_entry_mode(entry), h + c_mode_offset, c_mode_size);
	format_octal(archive_entry_uid(entry), h + c_uid_offset, c_uid_size);
	format_octal(archive_entry_gid(entry), h + c_gid_offset, c_gid_size);
	format_octal(archive_entry_nlink(entry), h + c_nlink_offset, c_nlink_size);
	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR)
	    format_octal(archive_entry_dev(entry), h + c_rdev_offset, c_rdev_size);
	else
	    format_octal(0, h + c_rdev_offset, c_rdev_size);
	format_octal(archive_entry_mtime(entry), h + c_mtime_offset, c_mtime_size);
	format_octal(pathlength, h + c_namesize_offset, c_namesize_size);

	/* Non-regular files don't store bodies. */
	if (archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	/* Symlinks get the link written as the body of the entry. */
	ret = archive_entry_symlink_l(entry, &p, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_symlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	if (len > 0 && p != NULL  &&  *p != '\0')
		ret = format_octal(strlen(p), h + c_filesize_offset,
		    c_filesize_size);
	else
		ret = format_octal(archive_entry_size(entry),
		    h + c_filesize_offset, c_filesize_size);
	if (ret) {
		archive_set_error(&a->archive, ERANGE,
		    "File is too large for cpio format.");
		ret_final = ARCHIVE_FAILED;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, h, sizeof(h));
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, path, pathlength);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	cpio->entry_bytes_remaining = archive_entry_size(entry);

	/* Write the symlink now. */
	if (p != NULL  &&  *p != '\0') {
		ret = __archive_write_output(a, p, strlen(p));
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}
exit_write_header:
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret_final);
}